

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
clear(InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
      *this)

{
  allocator<absl::lts_20250127::LogSink_*> *allocator;
  pointer destroy_first;
  size_type destroy_size;
  InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
  *this_local;
  
  allocator = inlined_vector_internal::
              Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>
              ::GetAllocator(&this->storage_);
  destroy_first = data(this);
  destroy_size = size(this);
  inlined_vector_internal::DestroyAdapter<std::allocator<absl::lts_20250127::LogSink_*>,_true>::
  DestroyElements(allocator,destroy_first,destroy_size);
  inlined_vector_internal::
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  DeallocateIfAllocated(&this->storage_);
  inlined_vector_internal::
  Storage<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>::
  SetInlinedSize(&this->storage_,0);
  return;
}

Assistant:

void clear() noexcept {
    inlined_vector_internal::DestroyAdapter<A>::DestroyElements(
        storage_.GetAllocator(), data(), size());
    storage_.DeallocateIfAllocated();

    storage_.SetInlinedSize(0);
  }